

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O0

void __thiscall
bloaty::RangeMap::
CheckConsistency<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter)

{
  unsigned_long uVar1;
  const_iterator iter_00;
  const_iterator iter_01;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  uint64_t uVar5;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> __x;
  _Base_ptr in_RSI;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar6;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_60;
  _Self local_58;
  _Base_ptr local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_40;
  _Base_ptr local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_28;
  _Self local_20;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> local_18 [2];
  iterator local_8;
  
  local_8._M_node = in_RSI;
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *
                      )0x1c5fb1);
  uVar1 = ppVar4->first;
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *
                      )0x1c5fc6);
  uVar5 = (ppVar4->second).size;
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *
                      )0x1c5fe4);
  if (uVar1 + uVar5 <= ppVar4->first) {
    __assert_fail("iter->first + iter->second.size > iter->first",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                  ,0xb5,
                  "void bloaty::RangeMap::CheckConsistency(T) const [T = std::_Rb_tree_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                 );
  }
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
  _Rb_tree_const_iterator(local_18,&local_8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::begin(in_stack_ffffffffffffff58._M_node);
  bVar2 = std::operator==(local_18,&local_20);
  bVar3 = true;
  if (!bVar2) {
    local_38 = local_8._M_node;
    local_30._M_node =
         (_Base_ptr)
         std::prev<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                   (in_stack_ffffffffffffff58,0x1c6077);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
    _Rb_tree_const_iterator(&local_28,&local_30);
    iter_00._M_node._7_1_ = in_stack_ffffffffffffff67;
    iter_00._M_node._0_7_ = in_stack_ffffffffffffff60;
    uVar5 = RangeEnd((RangeMap *)in_stack_ffffffffffffff58._M_node,iter_00);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                         *)0x1c60b2);
    bVar3 = uVar5 <= ppVar4->first;
  }
  if (!bVar3) {
    __assert_fail("iter == mappings_.begin() || RangeEnd(std::prev(iter)) <= iter->first",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                  ,0xb7,
                  "void bloaty::RangeMap::CheckConsistency(T) const [T = std::_Rb_tree_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                 );
  }
  local_50 = local_8._M_node;
  local_48._M_node =
       (_Base_ptr)
       std::next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                 (in_stack_ffffffffffffff58,0x1c610b);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
  _Rb_tree_const_iterator(&local_40,&local_48);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::end(in_stack_ffffffffffffff58._M_node);
  bVar3 = std::operator==(&local_40,&local_58);
  uVar6 = true;
  if (!bVar3) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
    _Rb_tree_const_iterator(&local_60,&local_8);
    iter_01._M_node._7_1_ = uVar6;
    iter_01._M_node._0_7_ = in_stack_ffffffffffffff60;
    __x._M_node = (_Base_ptr)RangeEnd(in_stack_ffffffffffffff58._M_node,iter_01);
    std::next<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
              (__x,0x1c618b);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                         *)0x1c619a);
    uVar6 = __x._M_node <= (_Base_ptr)ppVar4->first;
  }
  if ((bool)uVar6 == false) {
    __assert_fail("std::next(iter) == mappings_.end() || RangeEnd(iter) <= std::next(iter)->first",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                  ,0xb9,
                  "void bloaty::RangeMap::CheckConsistency(T) const [T = std::_Rb_tree_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                 );
  }
  return;
}

Assistant:

void CheckConsistency(T iter) const {
    assert(iter->first + iter->second.size > iter->first);
    assert(iter == mappings_.begin() ||
           RangeEnd(std::prev(iter)) <= iter->first);
    assert(std::next(iter) == mappings_.end() ||
           RangeEnd(iter) <= std::next(iter)->first);
  }